

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O0

UnicodeString * __thiscall icu_63::RegexMatcher::appendTail(RegexMatcher *this,UnicodeString *dest)

{
  UBool UVar1;
  undefined1 local_b0 [8];
  UText resultText;
  UErrorCode status;
  UnicodeString *dest_local;
  RegexMatcher *this_local;
  
  resultText.privC = 0;
  memset(local_b0,0,0x90);
  local_b0._0_4_ = 0x345ad82c;
  resultText.flags = 0x90;
  utext_openUnicodeString_63((UText *)local_b0,dest,&resultText.privC);
  UVar1 = ::U_SUCCESS(resultText.privC);
  if (UVar1 != '\0') {
    appendTail(this,(UText *)local_b0,&resultText.privC);
    utext_close_63((UText *)local_b0);
  }
  return dest;
}

Assistant:

UnicodeString &RegexMatcher::appendTail(UnicodeString &dest) {
    UErrorCode status = U_ZERO_ERROR;
    UText resultText = UTEXT_INITIALIZER;
    utext_openUnicodeString(&resultText, &dest, &status);

    if (U_SUCCESS(status)) {
        appendTail(&resultText, status);
        utext_close(&resultText);
    }

    return dest;
}